

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int vm_builtin_defined(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  SyHashEntry *pSVar1;
  int local_38;
  sxu32 local_34;
  int res;
  int nLen;
  char *zName;
  jx9_value **apArg_local;
  jx9_context *pjStack_18;
  int nArg_local;
  jx9_context *pCtx_local;
  
  local_34 = 0;
  local_38 = 0;
  zName = (char *)apArg;
  apArg_local._4_4_ = nArg;
  pjStack_18 = pCtx;
  if (nArg < 1) {
    jx9_context_throw_error(pCtx,3,"Missing constant name");
    jx9_result_bool(pjStack_18,0);
  }
  else {
    _res = jx9_value_to_string(*apArg,(int *)&local_34);
    if (0 < (int)local_34) {
      pSVar1 = SyHashGet(&pjStack_18->pVm->hConstant,_res,local_34);
      if (pSVar1 != (SyHashEntry *)0x0) {
        local_38 = 1;
      }
    }
    jx9_result_bool(pjStack_18,local_38);
  }
  return 0;
}

Assistant:

static int vm_builtin_defined(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zName;
	int nLen = 0;
	int res = 0;
	if( nArg < 1 ){
		/* Missing constant name, return FALSE */
		jx9_context_throw_error(pCtx,JX9_CTX_NOTICE,"Missing constant name");
		jx9_result_bool(pCtx, 0);
		return SXRET_OK;
	}
	/* Extract constant name */
	zName = jx9_value_to_string(apArg[0], &nLen);
	/* Perform the lookup */
	if( nLen > 0 && SyHashGet(&pCtx->pVm->hConstant, (const void *)zName, (sxu32)nLen) != 0 ){
		/* Already defined */
		res = 1;
	}
	jx9_result_bool(pCtx, res);
	return SXRET_OK;
}